

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleMenuItem::childAt(QAccessibleMenuItem *this,int x,int y)

{
  long lVar1;
  bool bVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  QAccessibleInterface *childInterface;
  int i;
  int local_34;
  QRect *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = (**(code **)(*in_RDI + 0x50))();
  do {
    local_34 = local_34 + -1;
    if (local_34 < 0) {
      local_20 = (QRect *)0x0;
      break;
    }
    local_20 = (QRect *)(**(code **)(*in_RDI + 0x48))(in_RDI,local_34);
    (**(code **)(*(long *)local_20 + 0x70))();
    bVar2 = QRect::contains(local_20,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  } while (!bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QAccessibleInterface *)local_20;
}

Assistant:

QAccessibleInterface *QAccessibleMenuItem::childAt(int x, int y ) const
{
    for (int i = childCount() - 1; i >= 0; --i) {
        QAccessibleInterface *childInterface = child(i);
        if (childInterface->rect().contains(x,y)) {
            return childInterface;
        }
    }
    return nullptr;
}